

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_back.hpp
# Opt level: O0

type_conflict2
sl::functional::detail::
call_bind_back<sl::nullables::detail::value_or_caller_fn_const&,std::tuple<int>const&,sl::nullables::adapter<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (value_or_caller_fn *func,tuple<int> *boundArgsTuple,
          adapter<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *callArgs)

{
  type_conflict2 tVar1;
  anon_class_16_2_27d33730 local_30;
  adapter<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_20;
  adapter<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *callArgs_local;
  tuple<int> *boundArgsTuple_local;
  value_or_caller_fn *func_local;
  
  local_30.func = func;
  local_30.callArgs = callArgs;
  local_20 = callArgs;
  callArgs_local =
       (adapter<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
        *)boundArgsTuple;
  boundArgsTuple_local = (tuple<int> *)func;
  tVar1 = std::
          apply<sl::functional::detail::call_bind_back<sl::nullables::detail::value_or_caller_fn_const&,std::tuple<int>const&,sl::nullables::adapter<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>(sl::nullables::detail::value_or_caller_fn_const&,std::tuple<int>const&,sl::nullables::adapter<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>&&)::_lambda<typename____T0>((_T0&&)___)_1_,std::tuple<int>const&>
                    (&local_30,boundArgsTuple);
  return tVar1;
}

Assistant:

constexpr decltype(auto) call_bind_back(Fn&& func, BoundArgsTuple&& boundArgsTuple, CallArgs&&... callArgs)
	{
		return std::apply(
			[&]<class... TArgs>(TArgs&&... boundArgs) -> decltype(auto)
			{
				return std::invoke(
					std::forward<Fn>(func),
					std::forward<CallArgs>(callArgs)...,
					std::forward<TArgs>(boundArgs)...);
			},
			std::forward<BoundArgsTuple>(boundArgsTuple));
	}